

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstring.cpp
# Opt level: O2

char * __thiscall FString::LockNewBuffer(FString *this,size_t len)

{
  char *pcVar1;
  
  FStringData::Release((FStringData *)(this->Chars + -0xc));
  AllocBuffer(this,len);
  pcVar1 = this->Chars;
  if (*(int *)(pcVar1 + -4) == 1) {
    pcVar1[-4] = -1;
    pcVar1[-3] = -1;
    pcVar1[-2] = -1;
    pcVar1[-1] = -1;
    return pcVar1;
  }
  __assert_fail("Data()->RefCount == 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/zstring.cpp"
                ,0xa3,"char *FString::LockNewBuffer(size_t)");
}

Assistant:

char *FString::LockNewBuffer(size_t len)
{
	Data()->Release();
	AllocBuffer(len);
	assert(Data()->RefCount == 1);
	Data()->RefCount = -1;
	return Chars;
}